

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall QtPrivate::QMovableArrayOps<QCursor>::Inserter::~Inserter(Inserter *this)

{
  long lVar1;
  long *in_RDI;
  long in_FS_OFFSET;
  qsizetype inserts;
  long local_20;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = in_RDI[3];
  if (in_RDI[1] != in_RDI[2]) {
    memmove((void *)in_RDI[1],(void *)in_RDI[2],in_RDI[4]);
    local_10 = in_RDI[1] - in_RDI[2] >> 3;
    lVar1 = qAbs<long>(&local_10);
    local_20 = local_20 - lVar1;
  }
  *(long *)(*in_RDI + 0x10) = *(long *)(*in_RDI + 0x10) + local_20;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~Inserter() {
            auto inserts = nInserts;
            if constexpr (!std::is_nothrow_copy_constructible_v<T>) {
                if (displaceFrom != displaceTo) {
                    ::memmove(static_cast<void *>(displaceFrom), static_cast<void *>(displaceTo), bytes);
                    inserts -= qAbs(displaceFrom - displaceTo);
                }
            }
            data->size += inserts;
        }